

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::ParameterParameter::Clear(ParameterParameter *this)

{
  LogMessage *other;
  BlobShape *this_00;
  LogFinisher local_49;
  LogMessage local_48;
  
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    this_00 = this->shape_;
    if (this_00 == (BlobShape *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_48,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                 ,0x7e13);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_48,"CHECK failed: shape_ != NULL: ");
      google::protobuf::internal::LogFinisher::operator=(&local_49,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_48);
      this_00 = this->shape_;
    }
    BlobShape::Clear(this_00);
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void ParameterParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.ParameterParameter)
  if (has_shape()) {
    GOOGLE_DCHECK(shape_ != NULL);
    shape_->::caffe::BlobShape::Clear();
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}